

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O3

Result __thiscall wabt::anon_unknown_14::NameResolver::BeginIfExpr(NameResolver *this,IfExpr *expr)

{
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->labels_,&(expr->true_).label);
  if ((expr->true_).decl.has_func_type == true) {
    ResolveVar(this,&this->current_module_->type_bindings,&(expr->true_).decl.type_var,"type");
  }
  return (Result)Ok;
}

Assistant:

Result NameResolver::BeginIfExpr(IfExpr* expr) {
  PushLabel(expr->true_.label);
  ResolveBlockDeclarationVar(&expr->true_.decl);
  return Result::Ok;
}